

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flex-estimation-test.cpp
# Opt level: O0

int test(void)

{
  Index *this;
  Scalar *pSVar1;
  long lVar2;
  Scalar *pSVar3;
  Index rows;
  TimeIndex TVar4;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar5;
  ostream *poVar6;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pDVar7;
  Index in_RCX;
  double dVar8;
  Scalar __x;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  PVar9;
  non_const_type local_ee0;
  non_const_type local_ed8;
  non_const_type local_ed0;
  non_const_type local_ec8;
  non_const_type local_ec0;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_eb8;
  MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_ea8 [32];
  non_const_type local_e88;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>
  local_e80;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_e53 [3];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_e50;
  AngleAxis<double> local_e30;
  Matrix3 local_e10;
  RealScalar local_dc8;
  double angle_1;
  Type local_db0;
  Matrix<double,3,1,0,3,1> local_d78 [8];
  Vector3 orientationV_1;
  Matrix3 Rh;
  Vector3 gh;
  non_const_type local_ce0;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>
  local_cd8;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_cab [3];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_ca8;
  AngleAxis<double> local_c88;
  Matrix3 local_c68;
  RealScalar local_c20;
  double angle;
  Type local_c08;
  Matrix<double,3,1,0,3,1> local_bd0 [8];
  Vector3 orientationV;
  Matrix3 R;
  Vector3 g;
  TimeIndex i_2;
  double error;
  ofstream f;
  undefined1 local_948 [8];
  IndexedVectorArray xh;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  contactPositions;
  undefined1 local_8c0 [8];
  Vector xh0;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_858;
  Type local_800;
  Type local_7c8;
  Type local_790;
  undefined1 local_758 [8];
  Vector3 accelerationFlex;
  Vector3 velocityFlex;
  Vector3 positionFlex;
  undefined1 local_6f0 [8];
  Matrix3 orientationFlexR;
  undefined1 local_670 [8];
  Vector3 angularAccelerationFlex;
  undefined1 local_620 [8];
  Vector3 angularVelocityFlex;
  undefined1 local_5d0 [8];
  Vector3 orientationFlexV;
  Vector x_1;
  Index i_1;
  int j;
  int i;
  undefined1 local_580 [8];
  Vector uk;
  undefined1 local_558 [8];
  Vector x0;
  DynamicalSystemSimulator sim;
  GaussianWhiteNoise local_458 [8];
  GaussianWhiteNoise MeasurementNoise;
  double local_408;
  IdentityReturnType local_400;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_3e8;
  undefined1 local_3a8 [8];
  Matrix r1;
  GaussianWhiteNoise processNoise;
  ConstantReturnType local_340;
  undefined1 local_328 [8];
  Matrix q1;
  IMUFixedContactDynamicalSystem imu;
  undefined1 local_188 [8];
  Vector3 contact;
  Matrix r;
  Matrix q;
  IndexedVectorArray u;
  undefined1 local_d8 [8];
  IndexedVectorArray y;
  IndexedVectorArray x;
  uint measurementSize;
  uint stateSize;
  double dt;
  Index kmax;
  
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&y.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_d8);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
            );
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             (contact.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  stateObservation::tools::ProbabilityLawSimulation::
  getUniformMatrix<Eigen::Matrix<double,3,1,0,3,1>>
            ((type *)local_188,(ProbabilityLawSimulation *)0x3,1,in_RCX,-1.0,1.0);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
  IMUFixedContactDynamicalSystem
            ((IMUFixedContactDynamicalSystem *)
             &q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             0.001);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero(&local_340,0x12,0x12);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_328,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_340);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_328,0x11
                      ,0x11);
  *pSVar1 = 1e-06;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_328,0x10
                      ,0x10);
  *pSVar1 = 1e-06;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_328,0xf,
                      0xf);
  *pSVar1 = 1e-06;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_328,0xb,
                      0xb);
  *pSVar1 = 0.0001;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_328,10,
                      10);
  *pSVar1 = 0.0001;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_328,9,9)
  ;
  *pSVar1 = 0.0001;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_328,5,5)
  ;
  *pSVar1 = 0.001;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_328,4,4)
  ;
  *pSVar1 = 0.001;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_328,3,3)
  ;
  *pSVar1 = 0.001;
  lVar2 = stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::getStateSize();
  stateObservation::GaussianWhiteNoise::GaussianWhiteNoise
            ((GaussianWhiteNoise *)
             &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             lVar2);
  stateObservation::GaussianWhiteNoise::setStandardDeviation
            ((Matrix *)
             &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::setProcessNoise
            ((NoiseBase *)
             &q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_400,6,6);
  local_408 = 0.0001;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
  ::operator*(&local_3e8,
              (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
               *)&local_400,&local_408);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_3a8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_3e8);
  lVar2 = stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
          getMeasurementSize();
  stateObservation::GaussianWhiteNoise::GaussianWhiteNoise(local_458,lVar2);
  stateObservation::GaussianWhiteNoise::setStandardDeviation((Matrix *)local_458);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::setMeasurementNoise
            ((NoiseBase *)
             &q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::DynamicalSystemSimulator::DynamicalSystemSimulator
            ((DynamicalSystemSimulator *)
             &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  stateObservation::DynamicalSystemSimulator::setDynamicsFunctor
            ((DynamicalSystemFunctorBase *)
             &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)
             &uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             0x12,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_558,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_558,0x11);
  *pSVar3 = 1e-05;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_558,0x10);
  *pSVar3 = 1e-05;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_558,0xf);
  *pSVar3 = 1e-05;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_558,0xb);
  *pSVar3 = 0.0001;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_558,10);
  *pSVar3 = 0.0001;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_558,9);
  *pSVar3 = 0.0001;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_558,5);
  *pSVar3 = 0.3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_558,4);
  *pSVar3 = 0.3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_558,3);
  *pSVar3 = 0.3;
  stateObservation::DynamicalSystemSimulator::setState
            ((Matrix *)
             &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (long)local_558);
  rows = stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::getInputSize();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((ConstantReturnType *)&j,rows,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_580,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&j);
  for (i_1._4_4_ = 0; (double)i_1._4_4_ < 300.0; i_1._4_4_ = i_1._4_4_ + 1) {
    dVar8 = sin((double)i_1._4_4_ * 0.3141592653589793);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,0);
    *pSVar3 = dVar8 * 0.4;
    dVar8 = sin((double)i_1._4_4_ * 0.2617993877991494);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,1);
    *pSVar3 = dVar8 * 0.6;
    dVar8 = sin((double)i_1._4_4_ * 0.6283185307179586);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,2);
    *pSVar3 = dVar8 * 0.2;
    dVar8 = sin((double)i_1._4_4_ * 0.2617993877991494);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,6);
    *pSVar3 = dVar8 * 0.1;
    dVar8 = sin((double)i_1._4_4_ * 0.20943951023931953);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,7);
    *pSVar3 = dVar8 * 0.07;
    dVar8 = sin((double)i_1._4_4_ * 0.6283185307179586);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,8);
    *pSVar3 = dVar8 * 0.05;
    dVar8 = sin((double)i_1._4_4_ * 0.2617993877991494);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,0xc)
    ;
    *pSVar3 = dVar8;
    dVar8 = sin((double)i_1._4_4_ * 0.20943951023931953);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,0xd)
    ;
    *pSVar3 = dVar8 * 0.07;
    dVar8 = sin((double)i_1._4_4_ * 0.3141592653589793);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,0xe)
    ;
    *pSVar3 = dVar8 * 0.05;
    dVar8 = sin((double)i_1._4_4_ * 0.2617993877991494);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,3);
    *pSVar3 = dVar8 + dVar8;
    dVar8 = sin((double)i_1._4_4_ * 0.17453292519943295);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,4);
    *pSVar3 = dVar8 * 1.5;
    dVar8 = sin((double)i_1._4_4_ * 0.5235987755982988);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,5);
    *pSVar3 = dVar8 * 0.8;
    dVar8 = sin((double)i_1._4_4_ * 0.2617993877991494);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,9);
    *pSVar3 = dVar8 * 0.2;
    dVar8 = sin((double)i_1._4_4_ * 0.2617993877991494);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,10);
    *pSVar3 = dVar8 * 0.07;
    dVar8 = sin((double)i_1._4_4_ * 0.6283185307179586);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_580,0xb)
    ;
    *pSVar3 = dVar8 * 0.05;
    for (i_1._0_4_ = 0; (int)i_1 < 10; i_1._0_4_ = (int)i_1 + 1) {
      stateObservation::
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols,(Matrix<double,__1,_1,_0,__1,_1> *)local_580,
                 (long)((int)i_1 + i_1._4_4_ * 10));
    }
    stateObservation::DynamicalSystemSimulator::setInput
              ((Matrix *)
               &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (long)local_580);
  }
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::setValue((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
             ,(Matrix<double,__1,_1,_0,__1,_1> *)local_580,(long)(i_1._4_4_ * 10));
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::setSamplingPeriod(0.001);
  for (x_1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      x_1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0xbb9;
      x_1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           x_1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 1)
  {
    stateObservation::DynamicalSystemSimulator::getState
              ((long)(orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((Type *)(angularVelocityFlex.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2),
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               (orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 2),3,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Matrix<double,3,1,0,3,1> *)local_5d0,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               (angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((Type *)(angularAccelerationFlex.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2),
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               (orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 2),9,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Matrix<double,3,1,0,3,1> *)local_620,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               (angularAccelerationFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                .m_storage.m_data.array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((Type *)(orientationFlexR.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 8),
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               (orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 2),0xf,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Matrix<double,3,1,0,3,1> *)local_670,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               (orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                m_storage.m_data.array + 8));
    stateObservation::kine::rotationVectorToAngleAxis
              ((AngleAxis *)
               (positionFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2),(Vector3 *)local_5d0);
    Eigen::RotationBase<Eigen::AngleAxis<double>,_3>::matrix
              ((RotationMatrixType *)local_6f0,
               (RotationBase<Eigen::AngleAxis<double>,_3> *)
               (positionFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (velocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (accelerationFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_758);
    stateObservation::kine::fixedPointRotationToTranslation
              ((Matrix3 *)local_6f0,(Vector3 *)local_620,(Vector3 *)local_670,(Vector3 *)local_188,
               (Vector3 *)
               (velocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2),
               (Vector3 *)
               (accelerationFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 2),(Vector3 *)local_758);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_790,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               (orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 2),0,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_790,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (velocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_7c8,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               (orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 2),6,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_7c8,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (accelerationFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_800,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               (orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 2),0xc,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_800,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_758);
    stateObservation::DynamicalSystemSimulator::setState
              ((Matrix *)
               &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (long)(orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + 2));
    stateObservation::DynamicalSystemSimulator::simulateDynamics();
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               (orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 2));
  }
  stateObservation::DynamicalSystemSimulator::getMeasurementArray
            ((long)&local_858,
             (long)&x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::operator=((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)local_d8,&local_858);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~IndexedMatrixArrayT(&local_858);
  stateObservation::DynamicalSystemSimulator::getStateArray
            ((long)&xh0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows,
             (long)&x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows);
  this = &xh0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::operator=((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&y.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node,
              (IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)this);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)this);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_580);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_558);
  stateObservation::DynamicalSystemSimulator::~DynamicalSystemSimulator
            ((DynamicalSystemSimulator *)
             &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  stateObservation::GaussianWhiteNoise::~GaussianWhiteNoise(local_458);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_3a8);
  stateObservation::GaussianWhiteNoise::~GaussianWhiteNoise
            ((GaussianWhiteNoise *)
             &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_328);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
  ~IMUFixedContactDynamicalSystem
            ((IMUFixedContactDynamicalSystem *)
             &q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)
             &contactPositions.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0x12,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_8c0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&contactPositions.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)&xh.v_.
               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&xh.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node,(value_type *)local_188);
  stateObservation::examples::offlineEKFFlexibilityEstimation
            ((IndexedVectorArray *)local_948,(IndexedVectorArray *)local_d8,
             (IndexedVectorArray *)
             &q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (Vector *)local_8c0,1,
             (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&xh.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,0.001,(IndexedVectorArray *)0x0,
             (IndexedVectorArray *)0x0);
  std::ofstream::ofstream(&error);
  std::ofstream::open(&error,"trajectory.dat",0x10);
  i_2 = 0;
  g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)stateObservation::
               IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
               ::getFirstIndex((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                *)local_d8);
  while( true ) {
    TVar4 = stateObservation::
            IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::getNextIndex((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)local_d8);
    if (TVar4 <= (long)g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2]) break;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8));
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
              ((Matrix<double,_3,_3,_0,_3,_3> *)
               (orientationV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2));
    pMVar5 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&y.v_.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,
                          (TimeIndex)
                          g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2]);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&angle,pMVar5)
    ;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_c08,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&angle,3,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              (local_bd0,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_c08);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&angle);
    local_c20 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_bd0);
    if (local_c20 <= 1e-16) {
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                ((Matrix<double,3,3,0,3,3> *)
                 (orientationV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),local_cab);
    }
    else {
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
                (&local_ca8,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_bd0,&local_c20);
      Eigen::AngleAxis<double>::
      AngleAxis<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                (&local_c88,&local_c20,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)&local_ca8);
      Eigen::AngleAxis<double>::toRotationMatrix(&local_c68,&local_c88);
      Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
                ((Matrix<double,_3,_3,_0,_3,_3> *)
                 (orientationV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),&local_c68);
    }
    local_ce0 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           (orientationV.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array + 2));
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
              (&local_cd8,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>> *)&local_ce0,
               (MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
                *)(gh.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + 2));
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8),
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>_>
                *)&local_cd8);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (Rh.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8));
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
              ((Matrix<double,_3,_3,_0,_3,_3> *)
               (orientationV_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 2));
    pMVar5 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_948,
                          (TimeIndex)
                          g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2]);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)&angle_1,pMVar5);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_db0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&angle_1,3,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              (local_d78,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_db0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&angle_1);
    local_dc8 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_d78);
    if (local_dc8 <= 1e-16) {
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                ((Matrix<double,3,3,0,3,3> *)
                 (orientationV_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),local_e53);
    }
    else {
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
                (&local_e50,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_d78,&local_dc8);
      Eigen::AngleAxis<double>::
      AngleAxis<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                (&local_e30,&local_dc8,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)&local_e50);
      Eigen::AngleAxis<double>::toRotationMatrix(&local_e10,&local_e30);
      Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
                ((Matrix<double,_3,_3,_0,_3,_3> *)
                 (orientationV_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),&local_e10);
    }
    local_e88 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           (orientationV_1.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array + 2));
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
              (&local_e80,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>> *)&local_e88,local_ea8
              );
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (Rh.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8),
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>_>
                *)&local_e80);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (Rh.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8));
    local_ec0 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                            .m_data.array + 8));
    PVar9 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                      ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>> *)&local_ec0,
                       (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       (Rh.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 8));
    local_eb8 = PVar9;
    __x = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_eb8);
    dVar8 = acos(__x);
    i_2 = (TimeIndex)((dVar8 * 180.0) / 3.141592653589793);
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (&error,(long)g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data.array[2]);
    poVar6 = std::operator<<(poVar6," \t ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(double)i_2);
    poVar6 = std::operator<<(poVar6," \t\t\t ");
    local_ec8 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                            .m_data.array + 8));
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       *)&local_ec8);
    poVar6 = std::operator<<(poVar6," \t\t\t ");
    local_ed0 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           (Rh.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 8));
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       *)&local_ed0);
    poVar6 = std::operator<<(poVar6," \t\t\t ");
    pDVar7 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&y.v_.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,
                          (TimeIndex)
                          g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2]);
    local_ed8 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose(pDVar7);
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&local_ed8);
    poVar6 = std::operator<<(poVar6," \t\t\t%%%%%%\t\t\t ");
    pDVar7 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_948,
                          (TimeIndex)
                          g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2]);
    local_ee0 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose(pDVar7);
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&local_ee0);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         (double)((long)g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] + 1);
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Error ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(double)i_2);
  std::operator<<(poVar6,", test: ");
  if ((double)i_2 <= 2.0) {
    std::operator<<((ostream *)&std::cout,"SUCCEEDED !!!!!!!");
  }
  else {
    std::operator<<((ostream *)&std::cout,"FAILED !!!!!!!");
  }
  kmax._4_4_ = (uint)((double)i_2 > 2.0);
  std::ofstream::~ofstream(&error);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_948);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)&xh.v_.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_8c0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             (contact.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
            );
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_d8);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&y.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  return kmax._4_4_;
}

Assistant:

int test()
{
  /// The number of samples
  const Index kmax = 3000;

  /// sampling period
  const double dt = 1e-3;

  /// Sizes of the states for the state, the measurement, and the input vector
  const unsigned stateSize = 18;
  const unsigned measurementSize = 6;
  // const unsigned inputSize=15;

  /// The array containing all the states, the measurements and the inputs
  IndexedVectorArray x;
  IndexedVectorArray y;
  IndexedVectorArray u;

  /// The covariance matrix of the process noise and the measurement noise
  Matrix q;
  Matrix r;

  Vector3 contact(tools::ProbabilityLawSimulation::getUniformMatrix<Vector3>());

  {
    /// simulation of the signal
    /// the IMU dynamical system functor
    flexibilityEstimation::IMUFixedContactDynamicalSystem imu(dt);

    /// The process noise initialization
    Matrix q1 = Matrix::Zero(stateSize, stateSize);
    q1(indexes::angAcc, indexes::angAcc) = q1(indexes::angAcc + 1, indexes::angAcc + 1) =
        q1(indexes::angAcc + 2, indexes::angAcc + 2) = 0.000001;
    q1(indexes::angVel, indexes::angVel) = q1(indexes::angVel + 1, indexes::angVel + 1) =
        q1(indexes::angVel + 2, indexes::angVel + 2) = 0.0001;
    q1(indexes::ori, indexes::ori) = q1(indexes::ori + 1, indexes::ori + 1) = q1(indexes::ori + 2, indexes::ori + 2) =
        0.001;

    GaussianWhiteNoise processNoise(imu.getStateSize());
    processNoise.setStandardDeviation(q1);
    imu.setProcessNoise(&processNoise);

    /// The measurement noise initialization
    Matrix r1 = Matrix::Identity(measurementSize, measurementSize) * 0.0001;
    GaussianWhiteNoise MeasurementNoise(imu.getMeasurementSize());
    MeasurementNoise.setStandardDeviation(r1);
    imu.setMeasurementNoise(&MeasurementNoise);

    /// the simulator initalization
    DynamicalSystemSimulator sim;
    sim.setDynamicsFunctor(&imu);

    /// initialization of the state vector
    Vector x0 = Vector::Zero(stateSize, 1);

    x0[indexes::angAcc] = x0[indexes::angAcc + 1] = x0[indexes::angAcc + 2] = 0.00001;

    x0[indexes::angVel] = x0[indexes::angVel + 1] = x0[indexes::angVel + 2] = 0.0001;

    x0[indexes::ori] = x0[indexes::ori + 1] = x0[indexes::ori + 2] = 0.3;

    // x0=x0*100;

    sim.setState(x0, 0);

    Vector uk = Vector::Zero(imu.getInputSize(), 1);

    int i;
    /// construction of the input
    /// the input is constant over 10 time samples
    for(i = 0; i < kmax / 10.0; ++i)
    {
      uk[indexes::pos] = 0.4 * sin(M_PI / 10 * i);
      uk[indexes::pos + 1] = 0.6 * sin(M_PI / 12 * i);
      uk[indexes::pos + 2] = 0.2 * sin(M_PI / 5 * i);

      uk[indexes::linVel] = 0.1 * sin(M_PI / 12 * i);
      uk[indexes::linVel + 1] = 0.07 * sin(M_PI / 15 * i);
      uk[indexes::linVel + 2] = 0.05 * sin(M_PI / 5 * i);

      uk[indexes::linAcc] = 1 * sin(M_PI / 12 * i);
      uk[indexes::linAcc + 1] = 0.07 * sin(M_PI / 15 * i);
      uk[indexes::linAcc + 2] = 0.05 * sin(M_PI / 10 * i);

      uk[indexes::ori] = 2 * sin(M_PI / 12 * i);
      uk[indexes::ori + 1] = 1.5 * sin(M_PI / 18 * i);
      uk[indexes::ori + 2] = 0.8 * sin(M_PI / 6 * i);

      uk[indexes::angVel] = 0.2 * sin(M_PI / 12 * i);
      uk[indexes::angVel + 1] = 0.07 * sin(M_PI / 12 * i);
      uk[indexes::angVel + 2] = 0.05 * sin(M_PI / 5 * i);

      /// filling the 10 time samples of the constant input
      for(int j = 0; j < 10; ++j)
      {
        u.setValue(uk, i * 10 + j);
      }

      /// give the input to the simulator
      /// we only need to give one value and the
      /// simulator takes automatically the appropriate value
      sim.setInput(uk, 10 * i);
    }

    /// Last sample needed
    u.setValue(uk, i * 10);

    /// set the sampling perdiod to the functor
    imu.setSamplingPeriod(dt);

    /// launched the simulation to the time kmax+1
    for(Index i = 0; i < kmax + 1; ++i)
    {
      Vector x = sim.getState(i);

      Vector3 orientationFlexV = x.segment(indexes::ori, 3);
      Vector3 angularVelocityFlex = x.segment(indexes::angVel, 3);
      Vector3 angularAccelerationFlex = x.segment(indexes::angAcc, 3);

      Matrix3 orientationFlexR = kine::rotationVectorToAngleAxis(orientationFlexV).matrix();

      Vector3 positionFlex;
      Vector3 velocityFlex;
      Vector3 accelerationFlex;

      kine::fixedPointRotationToTranslation(orientationFlexR, angularVelocityFlex, angularAccelerationFlex, contact,
                                            positionFlex, velocityFlex, accelerationFlex);

      x.segment(indexes::pos, 3) = positionFlex;
      x.segment(indexes::linVel, 3) = velocityFlex;
      x.segment(indexes::linAcc, 3) = accelerationFlex;

      sim.setState(x, i);

      sim.simulateDynamics();
    }

    /// extract the array of measurements and states
    y = sim.getMeasurementArray(1, kmax);
    x = sim.getStateArray(1, kmax);
  }

  /// the initalization of a random estimation of the initial state
  Vector xh0 = Vector::Zero(stateSize, 1);

  std::vector<Vector3, Eigen::aligned_allocator<Vector3>> contactPositions;

  contactPositions.push_back(contact);

  stateObservation::IndexedVectorArray xh =
      stateObservation::examples::offlineEKFFlexibilityEstimation(y, u, xh0, 1, contactPositions, dt);

  /// file of output
  std::ofstream f;
  f.open("trajectory.dat");

  double error = 0;

  /// the reconstruction of the state
  for(TimeIndex i = y.getFirstIndex(); i < y.getNextIndex(); ++i)
  {
    /// display part, useless
    Vector3 g;
    {
      Matrix3 R;
      Vector3 orientationV = Vector(x[i]).segment(indexes::ori, 3);
      double angle = orientationV.norm();
      if(angle > cst::epsilonAngle)
        R = AngleAxis(angle, orientationV / angle).toRotationMatrix();
      else
        R = Matrix3::Identity();
      g = R.transpose() * Vector3::UnitZ();
      g.normalize();
    }

    Vector3 gh;
    {
      Matrix3 Rh;

      Vector3 orientationV = Vector(xh[i]).segment(indexes::ori, 3);
      double angle = orientationV.norm();
      if(angle > cst::epsilonAngle)
        Rh = AngleAxis(angle, orientationV / angle).toRotationMatrix();
      else
        Rh = Matrix3::Identity();
      gh = Rh.transpose() * Vector3::UnitZ();
      gh.normalize();
    }

    error = acos(double(g.transpose() * gh)) * 180 / M_PI;

    f << i << " \t " << error << " \t\t\t " << g.transpose() << " \t\t\t " << gh.transpose() << " \t\t\t "
      << x[i].transpose() << " \t\t\t%%%%%%\t\t\t " << xh[i].transpose() << std::endl;
  }

  std::cout << "Error " << error << ", test: ";

  if(error > 2)
  {
    std::cout << "FAILED !!!!!!!";
    return 1;
  }
  else
  {
    std::cout << "SUCCEEDED !!!!!!!";
    return 0;
  }
}